

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O1

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>::Holder
          (Holder<(anonymous_namespace)::Q_QGS_tzZones> *this)

{
  QByteArrayView view;
  char16_t *pcVar1;
  QObjectData *data;
  QObjectData *pQVar2;
  bool bVar3;
  Territory TVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  qsizetype qVar8;
  Node<QByteArray,_QTzTimeZone> *pNVar9;
  QObjectData *in_RCX;
  QObjectData *pQVar10;
  int __oflag;
  __off_t __length;
  char *b;
  char *pcVar11;
  size_t __n;
  size_t sVar12;
  uint uVar13;
  long in_FS_OFFSET;
  QStringView code;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  QByteArrayView QVar14;
  const_iterator __begin1;
  undefined1 data_00 [8];
  QObjectData *pQVar15;
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> QStack_170;
  QObjectData *local_168;
  QByteArray local_158;
  QString local_138;
  QString local_118;
  DirEntry local_f8;
  QDirListing local_f0;
  QString local_e8;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 local_a8 [8];
  QObjectData *pQStack_a0;
  QObjectData *local_98;
  QObjectData *pQStack_90;
  QByteArray local_88;
  QFile local_68;
  char *local_58;
  QByteArray local_50;
  long local_38;
  storage_type_conflict *extraout_RDX;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_68);
  QVar14.m_data = (storage_type *)in_RCX;
  QVar14.m_size = (qsizetype)"zone.tab";
  QString::fromLatin1((QString *)local_a8,(QString *)0x8,QVar14);
  QStack_170.d = pQStack_a0;
  local_168 = local_98;
  data_00 = local_a8;
  bVar3 = openZoneInfo((QString *)&stack0xfffffffffffffe88,&local_68);
  if (data_00 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)&((QObjectData *)data_00)->_vptr_QObjectData)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&((QObjectData *)data_00)->_vptr_QObjectData)->_q_value).
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&((QObjectData *)data_00)->_vptr_QObjectData)->_q_value).
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)data_00,2,0x10);
    }
  }
  if (bVar3) {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>::instance()::holder
         = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0;
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char *)0x0;
    local_88.d.size = 0;
    while (pQVar10 = local_168, bVar3 = QIODevice::readLineInto((QIODevice *)&local_68,&local_88,0),
          bVar3) {
      view.m_data = (storage_type *)data_00;
      view.m_size = 0x40d3c7;
      QVar14 = QtPrivate::trimmed(view);
      ba.m_size = QVar14.m_data;
      sVar12 = QVar14.m_size;
      if ((sVar12 != 0) && (*ba.m_size != '#')) {
        if (((long)sVar12 < 1) || (pvVar6 = memchr(ba.m_size,9,sVar12), pvVar6 == (void *)0x0)) {
          uVar13 = 0xffffffff;
        }
        else {
          uVar13 = (int)pvVar6 - (int)QVar14.m_data;
        }
        if (0 < (int)uVar13) {
          local_a8 = (undefined1  [8])0xaaaaaaaaaaaa0000;
          pQStack_a0 = (QObjectData *)0x0;
          local_98 = (QObjectData *)0x0;
          pQStack_90 = (QObjectData *)0x0;
          ba.m_data = (storage_type *)in_RCX;
          QString::fromUtf8((QString *)&stack0xfffffffffffffe88,
                            (QString *)(ulong)(uVar13 & 0x7fffffff),ba);
          code.m_data = extraout_RDX;
          code.m_size = (qsizetype)QStack_170.d;
          TVar4 = QLocalePrivate::codeToTerritory((QLocalePrivate *)local_168,code);
          local_a8._0_2_ = TVar4;
          pQVar15 = (QObjectData *)data_00;
          if (data_00 != (undefined1  [8])0x0) {
            LOCK();
            (((QBasicAtomicInt *)&((QObjectData *)data_00)->_vptr_QObjectData)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&((QObjectData *)data_00)->_vptr_QObjectData)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&((QObjectData *)data_00)->_vptr_QObjectData)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)data_00,2,0x10);
              pQVar15 = (QObjectData *)data_00;
            }
          }
          uVar7 = (ulong)(uVar13 + 1);
          pcVar11 = ba.m_size + uVar7;
          __n = sVar12 - uVar7;
          if ((__n == 0 || (long)sVar12 < (long)uVar7) ||
             (pvVar6 = memchr(pcVar11,9,__n), pvVar6 == (void *)0x0)) {
            iVar5 = -1;
          }
          else {
            iVar5 = (int)pvVar6 - (int)pcVar11;
          }
          data_00 = (undefined1  [8])pQVar15;
          if (-1 < iVar5) {
            uVar7 = (ulong)(iVar5 + 1);
            pcVar11 = pcVar11 + uVar7;
            sVar12 = __n - uVar7;
            if ((sVar12 == 0 || (long)__n < (long)uVar7) ||
               (pvVar6 = memchr(pcVar11,9,sVar12), pvVar6 == (void *)0x0)) {
              uVar13 = 0xffffffff;
            }
            else {
              uVar13 = (int)pvVar6 - (int)pcVar11;
            }
            data_00 = (undefined1  [8])pQVar15;
            if (uVar13 != 0) {
              uVar7 = (ulong)(uVar13 & 0x7fffffff);
              if ((int)uVar13 < 1) {
                uVar7 = sVar12;
              }
              local_b8 = &DAT_aaaaaaaaaaaaaaaa;
              local_c8 = &DAT_aaaaaaaaaaaaaaaa;
              puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
              QByteArray::QByteArray((QByteArray *)&local_c8,pcVar11,uVar7);
              data_00 = (undefined1  [8])pQVar15;
              pQVar2 = pQStack_a0;
              if (0 < (int)uVar13) {
                QByteArray::QByteArray
                          ((QByteArray *)&stack0xfffffffffffffe88,pcVar11 + (uVar13 + 1),
                           sVar12 - (uVar13 + 1));
                pQVar2 = local_98;
                data = pQStack_a0;
                local_98 = QStack_170.d;
                QStack_170.d = pQVar2;
                local_168 = pQStack_90;
                pQStack_90 = pQVar10;
                in_RCX = pQVar10;
                data_00 = (undefined1  [8])pQStack_a0;
                pQVar2 = pQVar15;
                if (pQStack_a0 != (QObjectData *)0x0) {
                  LOCK();
                  *(int *)&pQStack_a0->_vptr_QObjectData =
                       *(int *)&pQStack_a0->_vptr_QObjectData + -1;
                  UNLOCK();
                  if (*(int *)&pQStack_a0->_vptr_QObjectData == 0) {
                    pQStack_a0 = pQVar15;
                    QArrayData::deallocate((QArrayData *)data,1,0x10);
                    in_RCX = pQVar10;
                    pQVar2 = pQStack_a0;
                  }
                }
              }
              pQStack_a0 = pQVar2;
              QHash<QByteArray,QTzTimeZone>::emplace<QTzTimeZone_const&>
                        ((QHash<QByteArray,QTzTimeZone> *)
                         &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>
                          ::instance()::holder,(QByteArray *)&local_c8,(QTzTimeZone *)local_a8);
              QtGlobalStatic::Holder((QtGlobalStatic *)&local_c8);
            }
          }
          QtGlobalStatic::Holder((QtGlobalStatic *)&pQStack_a0);
        }
      }
    }
    local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFile::fileName(&local_e8,&local_68);
    pcVar11 = (char *)0x1;
    qVar8 = QString::lastIndexOf(&local_e8,(QChar)0x2f,-1,CaseSensitive);
    QString::truncate(&local_e8,(char *)(qVar8 + 1),__length);
    qVar8 = local_e8.d.size;
    QDirListing::QDirListing(&local_f0,&local_e8,(IteratorFlags)0x400);
    local_f8.dirListPtr = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_f8.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_f0);
    for (; local_f8.dirListPtr != (QDirListingPrivate *)0x0; local_f8 = QDirListing::next(local_f8))
    {
      bVar3 = QDirListing::DirEntry::isFile(&local_f8);
      if ((bVar3) || (bVar3 = QDirListing::DirEntry::isSymLink(&local_f8), bVar3)) {
        local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QDirListing::DirEntry::absoluteFilePath(&local_118,&local_f8);
        local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString(&local_138,(QChar *)(local_118.d.ptr + qVar8),local_118.d.size - qVar8);
        bVar3 = QDirListing::DirEntry::isDir(&local_f8);
        pcVar1 = local_138.d.ptr;
        if (bVar3) {
          if ((undefined1 *)local_138.d.size == (undefined1 *)0x5) {
            rhs.m_data = "posix";
            rhs.m_size = 5;
            pcVar11 = "posix";
            lhs.m_data = local_138.d.ptr;
            lhs.m_size = 5;
            bVar3 = QtPrivate::equalStrings(lhs,rhs);
            if (!bVar3) {
              rhs_00.m_data = "right";
              rhs_00.m_size = 5;
              pcVar11 = "right";
              lhs_00.m_data = pcVar1;
              lhs_00.m_size = 5;
              bVar3 = QtPrivate::equalStrings(lhs_00,rhs_00);
              goto LAB_0040d798;
            }
          }
          else {
LAB_0040d7a0:
            local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_158.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
            QString::toLocal8Bit_helper(&local_158,(QChar *)local_138.d.ptr,local_138.d.size);
            if ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>::
                 instance()::holder == (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0) ||
               (pNVar9 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_>::
                         findNode<QByteArray>
                                   (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>
                                    ::instance()::holder,&local_158),
               pNVar9 == (Node<QByteArray,_QTzTimeZone> *)0x0)) {
              QFile::QFile((QFile *)&stack0xfffffffffffffe88,&local_118);
              iVar5 = QFile::open((QFile *)&stack0xfffffffffffffe88,(char *)0x1,__oflag);
              if ((char)iVar5 == '\0') {
                bVar3 = false;
              }
              else {
                QIODevice::read((QIODevice *)&local_50,(int)&stack0xfffffffffffffe88,(void *)0x4,
                                (size_t)pcVar11);
                local_58 = "TZif";
                bVar3 = ::operator==(&local_50,&local_58);
                if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
                  }
                }
              }
              QFile::~QFile((QFile *)&stack0xfffffffffffffe88);
              if (bVar3 != false) {
                QHash<QByteArray,QTzTimeZone>::emplace<QTzTimeZone_const&>
                          ((QHash<QByteArray,QTzTimeZone> *)
                           &QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>
                            ::instance()::holder,&local_158,(QTzTimeZone *)&stack0xfffffffffffffe88)
                ;
              }
            }
            if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,1,0x10);
              }
            }
          }
        }
        else {
          pcVar11 = (char *)0x1;
          s.m_data = "posix/";
          s.m_size = 6;
          bVar3 = QString::startsWith(&local_138,s,CaseSensitive);
          if (!bVar3) {
            pcVar11 = (char *)0x1;
            s_00.m_data = "right/";
            s_00.m_size = 6;
            bVar3 = QString::startsWith(&local_138,s_00,CaseSensitive);
LAB_0040d798:
            if (bVar3 == false) goto LAB_0040d7a0;
          }
        }
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    QDirListing::~QDirListing(&local_f0);
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  else {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>>::instance()::holder
         = (Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *)0x0;
  }
  QFile::~QFile(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }